

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

RK_S32 DecodeQuantizerDelta(vpBoolCoder_t *bit_ctx)

{
  RK_U32 RVar1;
  RK_U32 local_14;
  RK_S32 result;
  vpBoolCoder_t *bit_ctx_local;
  
  local_14 = 0;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xca,
               "DecodeQuantizerDelta");
  }
  RVar1 = vp8hwdDecodeBool128(bit_ctx);
  if (RVar1 != 0) {
    local_14 = vp8hwdReadBits(bit_ctx,4);
    RVar1 = vp8hwdDecodeBool128(bit_ctx);
    if (RVar1 != 0) {
      local_14 = -local_14;
    }
  }
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xd1,
               "DecodeQuantizerDelta");
  }
  return local_14;
}

Assistant:

static RK_S32 DecodeQuantizerDelta(vpBoolCoder_t *bit_ctx)
{
    RK_S32  result = 0;

    FUN_T("FUN_IN");
    if (vp8hwdDecodeBool128(bit_ctx)) {
        result = vp8hwdReadBits(bit_ctx, 4);
        if (vp8hwdDecodeBool128(bit_ctx))
            result = -result;
    }

    FUN_T("FUN_OUT");
    return result;
}